

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_stor_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  Curl_easy *data;
  CURLcode CVar1;
  _Bool connected;
  _Bool local_19;
  
  data = conn->data;
  if (ftpcode < 400) {
    (conn->proto).ftpc.state_saved = FTP_STOR;
    if ((data->set).ftp_use_port != true) {
      CVar1 = InitiateTransfer(conn);
      return CVar1;
    }
    (conn->proto).ftpc.state = FTP_STOP;
    CVar1 = AllowServerConnect(conn,&local_19);
    if ((CVar1 == CURLE_OK) && (local_19 == false)) {
      Curl_infof(data,"Data conn was not available immediately\n");
      (conn->proto).ftpc.wait_data_conn = true;
    }
  }
  else {
    Curl_failf(data,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
    (conn->proto).ftpc.state = FTP_STOP;
    CVar1 = CURLE_UPLOAD_FAILED;
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_state_stor_resp(struct connectdata *conn,
                                    int ftpcode, ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  if(ftpcode>=400) {
    failf(data, "Failed FTP upload: %0d", ftpcode);
    state(conn, FTP_STOP);
    /* oops, we never close the sockets! */
    return CURLE_UPLOAD_FAILED;
  }

  conn->proto.ftpc.state_saved = instate;

  /* PORT means we are now awaiting the server to connect to us. */
  if(data->set.ftp_use_port) {
    bool connected;

    state(conn, FTP_STOP); /* no longer in STOR state */

    result = AllowServerConnect(conn, &connected);
    if(result)
      return result;

    if(!connected) {
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      infof(data, "Data conn was not available immediately\n");
      ftpc->wait_data_conn = TRUE;
    }

    return CURLE_OK;
  }
  else
    return InitiateTransfer(conn);
}